

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

void malloc_mutex_prof_merge(mutex_prof_data_t *sum,mutex_prof_data_t *data)

{
  uint64_t uVar1;
  int iVar2;
  
  duckdb_je_nstime_add(&sum->tot_wait_time,&data->tot_wait_time);
  iVar2 = duckdb_je_nstime_compare(&sum->max_wait_time,&data->max_wait_time);
  if (iVar2 < 0) {
    duckdb_je_nstime_copy(&sum->max_wait_time,&data->max_wait_time);
  }
  uVar1 = data->n_spin_acquired;
  sum->n_wait_times = sum->n_wait_times + data->n_wait_times;
  sum->n_spin_acquired = sum->n_spin_acquired + uVar1;
  if (sum->max_n_thds < data->max_n_thds) {
    sum->max_n_thds = data->max_n_thds;
  }
  (sum->n_waiting_thds).repr = (data->n_waiting_thds).repr + (sum->n_waiting_thds).repr;
  sum->n_owner_switches = sum->n_owner_switches + data->n_owner_switches;
  sum->n_lock_ops = sum->n_lock_ops + data->n_lock_ops;
  return;
}

Assistant:

static inline void
malloc_mutex_prof_merge(mutex_prof_data_t *sum, mutex_prof_data_t *data) {
	nstime_add(&sum->tot_wait_time, &data->tot_wait_time);
	if (nstime_compare(&sum->max_wait_time, &data->max_wait_time) < 0) {
		nstime_copy(&sum->max_wait_time, &data->max_wait_time);
	}

	sum->n_wait_times += data->n_wait_times;
	sum->n_spin_acquired += data->n_spin_acquired;

	if (sum->max_n_thds < data->max_n_thds) {
		sum->max_n_thds = data->max_n_thds;
	}
	uint32_t cur_n_waiting_thds = atomic_load_u32(&sum->n_waiting_thds,
	    ATOMIC_RELAXED);
	uint32_t new_n_waiting_thds = cur_n_waiting_thds + atomic_load_u32(
	    &data->n_waiting_thds, ATOMIC_RELAXED);
	atomic_store_u32(&sum->n_waiting_thds, new_n_waiting_thds,
	    ATOMIC_RELAXED);
	sum->n_owner_switches += data->n_owner_switches;
	sum->n_lock_ops += data->n_lock_ops;
}